

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

bool __thiscall S2Builder::EdgeChainSimplifier::IsInterior(EdgeChainSimplifier *this,VertexId v)

{
  int iVar1;
  pointer piVar2;
  iterator iVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  int *piVar4;
  pointer ppVar5;
  bool bVar6;
  ulong uVar7;
  int *piVar8;
  Iterator __begin1;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  long lVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  EdgeId e_1;
  EdgeId e;
  int local_40;
  int local_38;
  int local_34;
  
  piVar2 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar9 = piVar2[v];
  iVar1 = piVar2[(long)v + 1];
  if (((iVar1 == iVar9) ||
      (piVar2 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start, iVar1 - iVar9 != piVar2[(long)v + 1] - piVar2[v]))
     || (v < this->builder_->num_forced_sites_)) {
    bVar6 = false;
  }
  else {
    piVar2 = (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar2) {
      (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar2;
    }
    do {
      iVar3._M_current =
           (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_34 = iVar9;
      if (iVar3._M_current ==
          (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->tmp_edges_,iVar3,&local_34);
      }
      else {
        *iVar3._M_current = iVar9;
        (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      iVar9 = iVar9 + 1;
    } while (iVar1 != iVar9);
    piVar2 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = piVar2[v];
    iVar1 = piVar2[(long)v + 1];
    if (iVar9 != iVar1) {
      piVar2 = (this->in_).in_edge_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar14 = (long)iVar9 << 2;
      do {
        local_38 = *(int *)((long)piVar2 + lVar14);
        iVar3._M_current =
             (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->tmp_edges_,iVar3,&local_38);
        }
        else {
          *iVar3._M_current = local_38;
          (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        lVar14 = lVar14 + 4;
      } while ((long)iVar1 * 4 != lVar14);
    }
    __first._M_current =
         (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__first._M_current != __last._M_current) {
      uVar7 = (long)__last._M_current - (long)__first._M_current >> 2;
      lVar14 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar14 == 0; lVar14 = lVar14 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::EdgeChainSimplifier::IsInterior(int)::__0>>
                (__first,__last,(ulong)(((uint)lVar14 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1536:41)>
                  )this);
      if ((long)__last._M_current - (long)__first._M_current < 0x41) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::EdgeChainSimplifier::IsInterior(int)::__0>>
                  (__first,__last,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1536:41)>
                    )this);
      }
      else {
        __last_00._M_current = __first._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::EdgeChainSimplifier::IsInterior(int)::__0>>
                  (__first,__last_00,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1536:41)>
                    )this);
        if (__last_00._M_current != __last._M_current) {
          piVar2 = (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            iVar9 = *__last_00._M_current;
            lVar14 = (long)__last_00._M_current[-1];
            piVar8 = __last_00._M_current;
            if (piVar2[iVar9] < piVar2[lVar14]) {
              do {
                *piVar8 = (int)lVar14;
                lVar14 = (long)piVar8[-2];
                piVar8 = piVar8 + -1;
              } while (piVar2[iVar9] < piVar2[lVar14]);
            }
            *piVar8 = iVar9;
            __last_00._M_current = __last_00._M_current + 1;
          } while (__last_00._M_current != __last._M_current);
        }
      }
    }
    piVar8 = (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar2 = (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_40 = -1;
    bVar6 = false;
    iVar9 = -1;
    while (bVar17 = piVar8 == piVar4, !bVar17) {
      iVar1 = *piVar8;
      iVar13 = 0;
      iVar10 = 0;
      iVar15 = 0;
      iVar16 = 0;
      do {
        iVar11 = *piVar8;
        if (piVar2[iVar11] != piVar2[iVar1]) break;
        ppVar5 = (this->g_->edges_->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        iVar12 = ppVar5[iVar11].first;
        iVar11 = ppVar5[iVar11].second;
        if (iVar12 == v) {
          if (iVar11 == v) {
            iVar13 = iVar13 + 1;
          }
          else {
            iVar12 = iVar11;
            if ((iVar9 < 0) || (iVar12 = iVar9, iVar9 == iVar11)) {
              iVar10 = iVar10 + 1;
              iVar9 = iVar12;
            }
            else {
              iVar12 = iVar11;
              if ((local_40 < 0) || (iVar12 = local_40, local_40 == iVar11)) {
                iVar15 = iVar15 + 1;
                local_40 = iVar12;
              }
              else {
                bVar6 = true;
              }
            }
          }
          iVar16 = iVar16 + (uint)(iVar11 != v);
          iVar13 = iVar13 + (uint)(iVar11 == v);
        }
        else if (iVar11 == v) {
          iVar16 = iVar16 + -1;
          iVar11 = iVar12;
          if ((iVar9 < 0) || (iVar11 = iVar9, iVar9 == iVar12)) {
            iVar10 = iVar10 + 1;
            iVar9 = iVar11;
          }
          else {
            iVar11 = iVar12;
            if ((local_40 < 0) || (iVar11 = local_40, local_40 == iVar12)) {
              local_40 = iVar11;
              iVar15 = iVar15 + 1;
            }
            else {
              bVar6 = true;
            }
          }
        }
        piVar8 = piVar8 + 1;
      } while (piVar8 != piVar4);
      if (bVar6) {
        return bVar17;
      }
      if (iVar16 != 0) {
        return bVar17;
      }
      if (iVar10 != iVar15) {
        return bVar17;
      }
      if ((iVar15 < 1) && (iVar13 != 0)) {
        return bVar17;
      }
    }
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

void S2Builder::CollectSiteEdges(const S2PointIndex<SiteId>& site_index) {
  // Find all points whose distance is <= edge_site_query_radius_ca_.
  S2ClosestPointQueryOptions options;
  options.set_conservative_max_distance(edge_site_query_radius_ca_);
  S2ClosestPointQuery<SiteId> site_query(&site_index, options);
  vector<S2ClosestPointQuery<SiteId>::Result> results;
  edge_sites_.resize(input_edges_.size());
  for (InputEdgeId e = 0; e < input_edges_.size(); ++e) {
    const InputEdge& edge = input_edges_[e];
    const S2Point& v0 = input_vertices_[edge.first];
    const S2Point& v1 = input_vertices_[edge.second];
    if (s2builder_verbose) {
      std::cout << "S2Polyline: " << s2textformat::ToString(v0)
                << ", " << s2textformat::ToString(v1) << "\n";
    }
    S2ClosestPointQueryEdgeTarget target(v0, v1);
    site_query.FindClosestPoints(&target, &results);
    auto* sites = &edge_sites_[e];
    sites->reserve(results.size());
    for (const auto& result : results) {
      sites->push_back(result.data());
      if (!snapping_needed_ &&
          result.distance() < min_edge_site_separation_ca_limit_ &&
          result.point() != v0 && result.point() != v1 &&
          s2pred::CompareEdgeDistance(result.point(), v0, v1,
                                      min_edge_site_separation_ca_) < 0) {
        snapping_needed_ = true;
      }
    }
    SortSitesByDistance(v0, sites);
  }
}